

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

string * __thiscall
slang::TimeScale::toString_abi_cxx11_(string *__return_storage_ptr__,TimeScale *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  string_view fmt;
  string local_78;
  string local_58;
  pointer local_38;
  size_type sStack_30;
  pointer local_28;
  size_type sStack_20;
  
  TimeScaleValue::toString_abi_cxx11_(&local_58,&this->base);
  TimeScaleValue::toString_abi_cxx11_(&local_78,&this->precision);
  local_38 = local_58._M_dataplus._M_p;
  sStack_30 = local_58._M_string_length;
  local_28 = local_78._M_dataplus._M_p;
  sStack_20 = local_78._M_string_length;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_38;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)0x7;
  ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)"{} / {}",fmt,args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TimeScale::toString() const {
    return fmt::format("{} / {}", base.toString(), precision.toString());
}